

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pages.c
# Opt level: O0

void os_pages_unmap(void *addr,size_t size)

{
  int iVar1;
  size_t in_RSI;
  void *in_RDI;
  char buf [64];
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  
  iVar1 = munmap(in_RDI,in_RSI);
  if (iVar1 == -1) {
    get_errno();
    duckdb_je_buferror(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,0x2549adc);
    duckdb_je_malloc_printf("<jemalloc>: Error in munmap(): %s\n",&stack0xffffffffffffffa8);
    if ((duckdb_je_opt_abort & 1U) != 0) {
      abort();
    }
  }
  return;
}

Assistant:

void
pages_unmap(void *addr, size_t size) {
	assert(PAGE_ADDR2BASE(addr) == addr);
	assert(PAGE_CEILING(size) == size);

	os_pages_unmap(addr, size);
}